

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerFacts.cpp
# Opt level: O2

SyntaxKind __thiscall
slang::parsing::LexerFacts::getDirectiveKind
          (LexerFacts *this,string_view directive,bool enableLegacyProtect)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  uint uVar9;
  uint64_t uVar10;
  undefined1 *puVar11;
  byte bVar12;
  char cVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  basic_string_view<char,_std::char_traits<char>_> *__y;
  undefined1 *this_00;
  undefined1 auVar17 [16];
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = (char *)directive._M_len;
  this_00 = directiveTable;
  if ((int)directive._M_str != 0) {
    this_00 = &directivesWithLegacyProtect;
  }
  local_40._M_len = (size_t)this;
  uVar10 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)this_00,
                      &local_40);
  uVar15 = uVar10 >> (*this_00 & 0x3f);
  lVar16 = (uVar10 & 0xff) * 4;
  cVar4 = (&UNK_0042856c)[lVar16];
  cVar5 = (&UNK_0042856d)[lVar16];
  cVar6 = (&UNK_0042856e)[lVar16];
  bVar7 = (&UNK_0042856f)[lVar16];
  uVar14 = 0;
  do {
    cVar13 = (char)directive._M_str;
    puVar11 = directiveTable;
    if (cVar13 != '\0') {
      puVar11 = &directivesWithLegacyProtect;
    }
    lVar16 = *(long *)(puVar11 + 0x10);
    pcVar1 = (char *)(lVar16 + uVar15 * 0x10);
    bVar12 = pcVar1[0xf];
    auVar17[0] = -(*pcVar1 == cVar4);
    auVar17[1] = -(pcVar1[1] == cVar5);
    auVar17[2] = -(pcVar1[2] == cVar6);
    auVar17[3] = -(pcVar1[3] == bVar7);
    auVar17[4] = -(pcVar1[4] == cVar4);
    auVar17[5] = -(pcVar1[5] == cVar5);
    auVar17[6] = -(pcVar1[6] == cVar6);
    auVar17[7] = -(pcVar1[7] == bVar7);
    auVar17[8] = -(pcVar1[8] == cVar4);
    auVar17[9] = -(pcVar1[9] == cVar5);
    auVar17[10] = -(pcVar1[10] == cVar6);
    auVar17[0xb] = -(pcVar1[0xb] == bVar7);
    auVar17[0xc] = -(pcVar1[0xc] == cVar4);
    auVar17[0xd] = -(pcVar1[0xd] == cVar5);
    auVar17[0xe] = -(pcVar1[0xe] == cVar6);
    auVar17[0xf] = -(bVar12 == bVar7);
    uVar9 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    if (uVar9 != 0) {
      puVar11 = directiveTable;
      if (cVar13 != '\0') {
        puVar11 = &directivesWithLegacyProtect;
      }
      lVar2 = *(long *)(puVar11 + 0x18);
      do {
        uVar3 = 0;
        if (uVar9 != 0) {
          for (; (uVar9 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        __y = (basic_string_view<char,_std::char_traits<char>_> *)
              ((ulong)uVar3 * 0x18 + lVar2 + uVar15 * 0x168);
        bVar8 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                           this_00,&local_40,__y);
        if (bVar8) {
          return (SyntaxKind)__y[1]._M_len;
        }
        uVar9 = uVar9 - 1 & uVar9;
      } while (uVar9 != 0);
      bVar12 = *(byte *)(lVar16 + uVar15 * 0x10 + 0xf);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7] & bVar12) == 0) {
      return MacroUsage;
    }
    puVar11 = directiveTable;
    if (cVar13 != '\0') {
      puVar11 = &directivesWithLegacyProtect;
    }
    lVar16 = uVar15 + uVar14;
    uVar14 = uVar14 + 1;
    uVar15 = lVar16 + 1U & *(ulong *)(puVar11 + 8);
  } while (uVar14 <= *(ulong *)(puVar11 + 8));
  return MacroUsage;
}

Assistant:

SyntaxKind LexerFacts::getDirectiveKind(std::string_view directive, bool enableLegacyProtect) {
    auto& table = enableLegacyProtect ? directivesWithLegacyProtect : directiveTable;
    if (auto it = table.find(directive); it != table.end())
        return it->second;
    return SyntaxKind::MacroUsage;
}